

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

lazy_trace_holder * __thiscall
cpptrace::detail::lazy_trace_holder::operator=(lazy_trace_holder *this,lazy_trace_holder *other)

{
  lazy_trace_holder *other_local;
  lazy_trace_holder *this_local;
  
  clear(this);
  this->resolved = (bool)(other->resolved & 1);
  if ((other->resolved & 1U) == 0) {
    raw_trace::raw_trace(&(this->field_1).trace,&(other->field_1).trace);
  }
  else {
    stacktrace::stacktrace(&(this->field_1).resolved_trace,&(other->field_1).resolved_trace);
  }
  return this;
}

Assistant:

lazy_trace_holder& lazy_trace_holder::operator=(lazy_trace_holder&& other) noexcept {
            clear();
            resolved = other.resolved;
            if(other.resolved) {
                new (&resolved_trace) stacktrace(std::move(other.resolved_trace));
            } else {
                new (&trace) raw_trace(std::move(other.trace));
            }
            return *this;
        }